

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void Abc_NtkDumpOneCexSpecial(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex)

{
  long *plVar1;
  bool bVar2;
  Aig_Man_t *p;
  Abc_Cex_t *pAVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  Abc_Cex_t *local_38;
  
  p = Abc_NtkToDar(pNtk,0,1);
  pAVar3 = Bmc_CexCareMinimize(p,p->nTruePis,pCex,4,0,0);
  local_38 = pAVar3;
  Aig_ManStop(p);
  if (pAVar3 == (Abc_Cex_t *)0x0) {
    puts("Counter-example minimization has failed.");
    return;
  }
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      plVar1 = (long *)pVVar5->pArray[lVar9];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[6] * 8));
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
        }
        fprintf((FILE *)pFile,"CEX: %s@0=%c\n",pcVar4,(ulong)(plVar1[7] == 1 ^ 0x31));
        pVVar5 = pNtk->vBoxes;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar5->nSize);
  }
  iVar6 = pCex->iFrame;
  if (-1 < iVar6) {
    pVVar5 = pNtk->vPis;
    uVar8 = 0;
    do {
      if (0 < pVVar5->nSize) {
        lVar9 = 0;
        do {
          uVar7 = pAVar3->nPis * uVar8 + pAVar3->nRegs + (int)lVar9;
          if (((uint)(&pAVar3[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) {
            pcVar4 = Abc_ObjName((Abc_Obj_t *)pVVar5->pArray[lVar9]);
            uVar7 = pCex->nPis * uVar8 + pCex->nRegs + (int)lVar9;
            fprintf((FILE *)pFile,"CEX: %s@%d=%c\n",pcVar4,(ulong)uVar8,
                    (ulong)((((uint)(&pCex[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) +
                           0x30));
            pVVar5 = pNtk->vPis;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar5->nSize);
        iVar6 = pCex->iFrame;
      }
      bVar2 = (int)uVar8 < iVar6;
      uVar8 = uVar8 + 1;
    } while (bVar2);
  }
  Abc_CexFreeP(&local_38);
  return;
}

Assistant:

void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pCare = NULL; int i, f; Abc_Obj_t * pObj;
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
    //fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
    //fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
    pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, 0, 0 );
    Aig_ManStop( pAig );
    if( pCare == NULL )   
    {
        printf( "Counter-example minimization has failed.\n" ); 
        return;
    }
    // output flop values (unaffected by the minimization)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "CEX: %s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
    // output PI values (while skipping the minimized ones)
    for ( f = 0; f <= pCex->iFrame; f++ )
        Abc_NtkForEachPi( pNtk, pObj, i )
            if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                fprintf( pFile, "CEX: %s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
    Abc_CexFreeP( &pCare );
}